

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O2

tuple<const_long_&,_const_long_&>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>&,boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>&>>
          (_Tuple_impl<1UL,_const_long_&> param_1,undefined8 param_2,undefined8 *param_3)

{
  reference plVar1;
  reference plVar2;
  _Head_base<0UL,_const_long_&,_false> extraout_RDX;
  tuple<const_long_&,_const_long_&> tVar3;
  
  plVar1 = boost::iterator_range_detail::
           iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                    *)param_3[1]);
  plVar2 = boost::iterator_range_detail::
           iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                    *)*param_3);
  *(reference *)param_1.super__Head_base<1UL,_const_long_&,_false>._M_head_impl = plVar2;
  *(reference *)((long)param_1.super__Head_base<1UL,_const_long_&,_false>._M_head_impl + 8) = plVar1
  ;
  tVar3.super__Tuple_impl<0UL,_const_long_&,_const_long_&>.
  super__Head_base<0UL,_const_long_&,_false>._M_head_impl = extraout_RDX._M_head_impl;
  tVar3.super__Tuple_impl<0UL,_const_long_&,_const_long_&>.super__Tuple_impl<1UL,_const_long_&>.
  super__Head_base<1UL,_const_long_&,_false>._M_head_impl =
       param_1.super__Head_base<1UL,_const_long_&,_false>._M_head_impl;
  return (tuple<const_long_&,_const_long_&>)tVar3.super__Tuple_impl<0UL,_const_long_&,_const_long_&>
  ;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }